

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCore.c
# Opt level: O3

void Sbd_ManPrintObj(Sbd_Man_t *p,int Pivot)

{
  uint uVar1;
  word *pwVar2;
  word *pwVar3;
  Vec_Wrd_t *p_00;
  ulong uVar4;
  char cVar5;
  short sVar6;
  Sbd_Par_t *pSVar7;
  Vec_Int_t *pVVar8;
  byte bVar9;
  byte bVar10;
  ulong uVar11;
  Vec_Int_t *pVVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  int iVar18;
  long lVar19;
  uint uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  uint uVar24;
  
  if ((Pivot < 0) || (p->vObj2Var->nSize <= Pivot)) {
LAB_005423a9:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  uVar1 = p->vObj2Var->pArray[(uint)Pivot];
  uVar23 = (ulong)uVar1;
  if (-1 < (int)uVar1) {
    lVar13 = 0;
    do {
      if (p->vWinObjs->nSize <= lVar13) goto LAB_005423a9;
      uVar24 = p->vWinObjs->pArray[lVar13];
      printf("%3d : ",(ulong)uVar24);
      uVar24 = uVar24 * p->pPars->nWords;
      if (((int)uVar24 < 0) || (p->vSims[0]->nSize <= (int)uVar24)) goto LAB_0054238a;
      Extra_PrintBinary(_stdout,(uint *)(p->vSims[0]->pArray + uVar24),0x40);
      putchar(10);
      lVar13 = lVar13 + 1;
    } while (uVar23 + 1 != lVar13);
  }
  if (p->Pivot != Pivot) {
    __assert_fail("p->Pivot == Pivot",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdCore.c"
                  ,0x29b,"void Sbd_ManPrintObj(Sbd_Man_t *, int)");
  }
  p->vCounts[0]->nSize = 0;
  p->vCounts[1]->nSize = 0;
  printf("Node %d.  Useful divisors = %d.\n",(ulong)(uint)Pivot,(ulong)(uint)p->vDivValues->nSize);
  printf("Lev : ");
  if (-1 < (int)uVar1) {
    uVar21 = 0;
    do {
      if ((long)p->vWinObjs->nSize <= (long)uVar21) goto LAB_005423a9;
      uVar24 = p->vWinObjs->pArray[uVar21];
      if (uVar23 == uVar21) {
        putchar(0x20);
      }
      if (((int)uVar24 < 0) || (p->vLutLevs->nSize <= (int)uVar24)) goto LAB_005423a9;
      printf("%d",(ulong)(uint)p->vLutLevs->pArray[uVar24]);
      uVar21 = uVar21 + 1;
    } while (uVar23 + 1 != uVar21);
  }
  putchar(10);
  putchar(10);
  if (0x62 < (int)uVar1) {
    printf("    : ");
    uVar21 = 0;
    do {
      if ((long)p->vWinObjs->nSize <= (long)uVar21) goto LAB_005423a9;
      iVar18 = p->vWinObjs->pArray[uVar21];
      if (uVar23 == uVar21) {
        putchar(0x20);
      }
      printf("%d",(ulong)(uint)(iVar18 / 100));
      uVar21 = uVar21 + 1;
    } while (uVar23 + 1 != uVar21);
    putchar(10);
  }
  if (8 < (int)uVar1) {
    printf("    : ");
    uVar21 = 0;
    do {
      if ((long)p->vWinObjs->nSize <= (long)uVar21) goto LAB_005423a9;
      iVar18 = p->vWinObjs->pArray[uVar21];
      if (uVar23 == uVar21) {
        putchar(0x20);
      }
      cVar5 = (char)iVar18 +
              ((char)(uint)((ulong)((long)iVar18 * 0x51eb851f) >> 0x25) - (char)(iVar18 >> 0x1f)) *
              -100;
      sVar6 = cVar5 * 0x67;
      cVar5 = (char)((uint)(int)sVar6 >> 10) - (cVar5 >> 7);
      printf("%d",(ulong)(uint)(int)cVar5,(ulong)((long)iVar18 * 0x51eb851f) >> 0x3f,
             (ulong)CONCAT31((uint3)(int3)(char)((ushort)sVar6 >> 8) >> 10,cVar5));
      uVar21 = uVar21 + 1;
    } while (uVar23 + 1 != uVar21);
    putchar(10);
  }
  if (-1 < (int)uVar1) {
    printf("    : ");
    uVar21 = 0;
    do {
      if ((long)p->vWinObjs->nSize <= (long)uVar21) goto LAB_005423a9;
      iVar18 = p->vWinObjs->pArray[uVar21];
      if (uVar23 == uVar21) {
        putchar(0x20);
      }
      printf("%d",(ulong)(uint)(iVar18 % 10));
      uVar21 = uVar21 + 1;
    } while (uVar23 + 1 != uVar21);
    putchar(10);
    putchar(10);
  }
  pSVar7 = p->pPars;
  iVar18 = pSVar7->nWords;
  if (0 < iVar18) {
    uVar21 = (ulong)(uVar1 + 1);
    uVar15 = 0;
    do {
      uVar24 = iVar18 * Pivot;
      if (((int)uVar24 < 0) || (p->vSims[2]->nSize <= (int)uVar24)) {
LAB_0054238a:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                      ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
      }
      uVar4 = uVar15 >> 6;
      uVar20 = (uint)uVar15;
      uVar11 = (ulong)(uVar20 & 0x3f);
      uVar22 = 1L << (sbyte)(uVar20 & 0x3f);
      if ((p->vSims[2]->pArray[uVar24 + uVar4] >> (uVar15 & 0x3f) & 1) != 0) {
        printf("%3d : ",uVar15);
        if ((int)uVar1 < 0) {
          putchar(10);
          printf("%3d : ",uVar15);
LAB_00541fc7:
          putchar(10);
          printf("Sims: ");
          if (-1 < (int)uVar1) {
            uVar15 = 0;
            do {
              if ((long)p->vWinObjs->nSize <= (long)uVar15) goto LAB_005423a9;
              uVar24 = p->pPars->nWords * p->vWinObjs->pArray[uVar15];
              if (((int)uVar24 < 0) || (p->vSims[0]->nSize <= (int)uVar24)) goto LAB_0054238a;
              pwVar2 = p->vSims[0]->pArray;
              if (uVar23 == uVar15) {
                putchar(0x20);
              }
              putchar(((pwVar2[uVar24 + uVar4] >> uVar11 & 1) != 0) + 0x30);
              uVar15 = uVar15 + 1;
            } while (uVar21 != uVar15);
            goto LAB_00542098;
          }
          putchar(10);
          printf("Ctrl: ");
        }
        else {
          uVar14 = 0;
          do {
            if ((long)p->vWinObjs->nSize <= (long)uVar14) goto LAB_005423a9;
            uVar24 = p->pPars->nWords * p->vWinObjs->pArray[uVar14];
            if ((((int)uVar24 < 0) || (p->vSims[0]->nSize <= (int)uVar24)) ||
               (p->vSims[2]->nSize <= (int)uVar24)) goto LAB_0054238a;
            pwVar2 = p->vSims[0]->pArray;
            pwVar3 = p->vSims[2]->pArray;
            if (uVar23 == uVar14) {
              if ((pwVar3[uVar24 + uVar4] & uVar22) != 0) {
                Vec_IntPush(p->vCounts[(pwVar2[uVar24 + uVar4] >> uVar11 & 1) != 0],uVar20);
              }
              putchar(0x20);
            }
            if ((pwVar3[uVar24 + uVar4] & uVar22) == 0) {
              iVar18 = 0x2e;
            }
            else {
              iVar18 = ((pwVar2[uVar24 + uVar4] >> uVar11 & 1) != 0) + 0x30;
            }
            putchar(iVar18);
            uVar14 = uVar14 + 1;
          } while (uVar21 != uVar14);
          putchar(10);
          printf("%3d : ",uVar15);
          if (-1 < (int)uVar1) {
            uVar15 = 0;
            do {
              if ((long)p->vWinObjs->nSize <= (long)uVar15) goto LAB_005423a9;
              uVar24 = p->pPars->nWords * p->vWinObjs->pArray[uVar15];
              if ((((int)uVar24 < 0) || (p->vSims[0]->nSize <= (int)uVar24)) ||
                 (p->vSims[3]->nSize <= (int)uVar24)) goto LAB_0054238a;
              pwVar2 = p->vSims[0]->pArray;
              pwVar3 = p->vSims[3]->pArray;
              if (uVar23 == uVar15) {
                if ((pwVar3[uVar24 + uVar4] & uVar22) != 0) {
                  Vec_IntPush(p->vCounts[(pwVar2[uVar24 + uVar4] >> uVar11 & 1) != 0],uVar20);
                }
                putchar(0x20);
              }
              if ((pwVar3[uVar24 + uVar4] & uVar22) == 0) {
                iVar18 = 0x2e;
              }
              else {
                iVar18 = ((pwVar2[uVar24 + uVar4] >> uVar11 & 1) != 0) + 0x30;
              }
              putchar(iVar18);
              uVar15 = uVar15 + 1;
            } while (uVar21 != uVar15);
            goto LAB_00541fc7;
          }
          putchar(10);
          printf("Sims: ");
LAB_00542098:
          putchar(10);
          printf("Ctrl: ");
          if (-1 < (int)uVar1) {
            uVar15 = 0;
            do {
              if ((long)p->vWinObjs->nSize <= (long)uVar15) goto LAB_005423a9;
              uVar24 = p->pPars->nWords * p->vWinObjs->pArray[uVar15];
              if (((int)uVar24 < 0) || (p->vSims[2]->nSize <= (int)uVar24)) goto LAB_0054238a;
              pwVar2 = p->vSims[2]->pArray;
              if (uVar23 == uVar15) {
                putchar(0x20);
              }
              putchar(((pwVar2[uVar24 + uVar4] >> uVar11 & 1) != 0) + 0x30);
              uVar15 = uVar15 + 1;
            } while (uVar21 != uVar15);
          }
        }
        putchar(10);
        putchar(10);
        pSVar7 = p->pPars;
      }
      uVar15 = (ulong)(uVar20 + 1);
      iVar18 = pSVar7->nWords;
    } while ((int)(uVar20 + 1) < iVar18 * 0x40);
  }
  printf("Exploring %d x %d covering table.\n",(ulong)(uint)p->vCounts[0]->nSize,
         (ulong)(uint)p->vCounts[1]->nSize);
  p->vMatrix->nSize = 0;
  pVVar8 = p->vCounts[0];
  if (0 < pVVar8->nSize) {
    pVVar12 = p->vCounts[1];
    lVar13 = 0;
    do {
      if (0 < pVVar12->nSize) {
        lVar16 = (long)(pVVar8->pArray[lVar13] >> 6);
        bVar9 = (byte)pVVar8->pArray[lVar13] & 0x3f;
        lVar17 = 0;
        do {
          if ((int)uVar1 < 0) {
            uVar23 = 0;
          }
          else {
            uVar24 = p->vWinObjs->nSize;
            lVar19 = (long)(pVVar12->pArray[lVar17] >> 6);
            bVar10 = (byte)pVVar12->pArray[lVar17] & 0x3f;
            if ((int)uVar24 < 1) {
              uVar24 = 0;
            }
            uVar21 = 0;
            uVar23 = 0;
            do {
              if (uVar24 == uVar21) goto LAB_005423a9;
              uVar20 = p->pPars->nWords * p->vWinObjs->pArray[uVar21];
              if ((((int)uVar20 < 0) || (p->vSims[0]->nSize <= (int)uVar20)) ||
                 (p->vSims[2]->nSize <= (int)uVar20)) goto LAB_0054238a;
              pwVar2 = p->vSims[2]->pArray;
              if ((((pwVar2[(ulong)uVar20 + lVar16] & 1L << bVar9) != 0) &&
                  ((pwVar2[(ulong)uVar20 + lVar19] & 1L << bVar10) != 0)) &&
                 (pwVar2 = p->vSims[0]->pArray,
                 (((uint)(pwVar2[(ulong)uVar20 + lVar19] >> bVar10) ^
                  (uint)(pwVar2[(ulong)uVar20 + lVar16] >> bVar9)) & 1) != 0)) {
                uVar23 = uVar23 ^ 1L << (uVar21 & 0x3f);
              }
              uVar21 = uVar21 + 1;
            } while (uVar1 + 1 != uVar21);
          }
          p_00 = p->vMatrix;
          if (0 < (long)p_00->nSize) {
            lVar19 = 0;
            do {
              if (p_00->pArray[lVar19] == uVar23) goto LAB_00542331;
              lVar19 = lVar19 + 1;
            } while (p_00->nSize != lVar19);
          }
          Vec_WrdPush(p_00,uVar23);
          if (-1 < (int)uVar1) {
            uVar21 = 0;
            do {
              printf("%d",(ulong)((uVar23 >> (uVar21 & 0x3f) & 1) != 0));
              uVar21 = uVar21 + 1;
            } while (uVar1 + 1 != uVar21);
          }
          putchar(10);
          pVVar12 = p->vCounts[1];
LAB_00542331:
          lVar17 = lVar17 + 1;
          iVar18 = pVVar12->nSize;
          if (0x3f < iVar18) {
            iVar18 = 0x40;
          }
        } while (lVar17 < iVar18);
        pVVar8 = p->vCounts[0];
      }
      lVar13 = lVar13 + 1;
      iVar18 = pVVar8->nSize;
      if (0x3f < iVar18) {
        iVar18 = 0x40;
      }
    } while (lVar13 < iVar18);
  }
  return;
}

Assistant:

void Sbd_ManPrintObj( Sbd_Man_t * p, int Pivot )
{
    int nDivs = Vec_IntEntry(p->vObj2Var, Pivot) + 1;
    int i, k, k0, k1, Id, Bit0, Bit1;

    Vec_IntForEachEntryStop( p->vWinObjs, Id, i, nDivs )
        printf( "%3d : ", Id ), Extra_PrintBinary( stdout, (unsigned *)Sbd_ObjSim0(p, Id), 64 ), printf( "\n" );

    assert( p->Pivot == Pivot );
    Vec_IntClear( p->vCounts[0] );
    Vec_IntClear( p->vCounts[1] );

    printf( "Node %d.  Useful divisors = %d.\n", Pivot, Vec_IntSize(p->vDivValues) );
    printf( "Lev : " );
    Vec_IntForEachEntryStop( p->vWinObjs, Id, i, nDivs )
    {
        if ( i == nDivs-1 )
            printf( " " );
        printf( "%d", Vec_IntEntry(p->vLutLevs, Id) );
    }
    printf( "\n" );
    printf( "\n" );

    if ( nDivs > 99 )
    {
        printf( "    : " );
        Vec_IntForEachEntryStop( p->vWinObjs, Id, i, nDivs )
        {
            if ( i == nDivs-1 )
                printf( " " );
            printf( "%d", Id / 100 );
        }
        printf( "\n" );
    }
    if ( nDivs > 9 )
    {
        printf( "    : " );
        Vec_IntForEachEntryStop( p->vWinObjs, Id, i, nDivs )
        {
            if ( i == nDivs-1 )
                printf( " " );
            printf( "%d", (Id % 100) / 10 );
        }
        printf( "\n" );
    }
    if ( nDivs > 0 )
    {
        printf( "    : " );
        Vec_IntForEachEntryStop( p->vWinObjs, Id, i, nDivs )
        {
            if ( i == nDivs-1 )
                printf( " " );
            printf( "%d", Id % 10 );
        }
        printf( "\n" );
        printf( "\n" );
    }

    // sampling matrix
    for ( k = 0; k < p->pPars->nWords * 64; k++ )
    {
        if ( !Abc_TtGetBit(Sbd_ObjSim2(p, Pivot), k) )
            continue;

        printf( "%3d : ", k );
        Vec_IntForEachEntryStop( p->vWinObjs, Id, i, nDivs )
        {
            word * pSims = Sbd_ObjSim0( p, Id );
            word * pCtrl = Sbd_ObjSim2( p, Id );
            if ( i == nDivs-1 )
            {
                if ( Abc_TtGetBit(pCtrl, k) )
                    Vec_IntPush( p->vCounts[Abc_TtGetBit(pSims, k)], k );
                printf( " " );
            }
            printf( "%c", Abc_TtGetBit(pCtrl, k) ? '0' + Abc_TtGetBit(pSims, k) : '.' );
        }
        printf( "\n" );

        printf( "%3d : ", k );
        Vec_IntForEachEntryStop( p->vWinObjs, Id, i, nDivs )
        {
            word * pSims = Sbd_ObjSim0( p, Id );
            word * pCtrl = Sbd_ObjSim3( p, Id );
            if ( i == nDivs-1 )
            {
                if ( Abc_TtGetBit(pCtrl, k) )
                    Vec_IntPush( p->vCounts[Abc_TtGetBit(pSims, k)], k );
                printf( " " );
            }
            printf( "%c", Abc_TtGetBit(pCtrl, k) ? '0' + Abc_TtGetBit(pSims, k) : '.' );
        }
        printf( "\n" );

        printf( "Sims: " );
        Vec_IntForEachEntryStop( p->vWinObjs, Id, i, nDivs )
        {
            word * pSims = Sbd_ObjSim0( p, Id );
            //word * pCtrl = Sbd_ObjSim2( p, Id );
            if ( i == nDivs-1 )
                printf( " " );
            printf( "%c", '0' + Abc_TtGetBit(pSims, k) );
        }
        printf( "\n" );

        printf( "Ctrl: " );
        Vec_IntForEachEntryStop( p->vWinObjs, Id, i, nDivs )
        {
            //word * pSims = Sbd_ObjSim0( p, Id );
            word * pCtrl = Sbd_ObjSim2( p, Id );
            if ( i == nDivs-1 )
                printf( " " );
            printf( "%c", '0' + Abc_TtGetBit(pCtrl, k) );
        }
        printf( "\n" );


        printf( "\n" );
    }
    // covering table
    printf( "Exploring %d x %d covering table.\n", Vec_IntSize(p->vCounts[0]), Vec_IntSize(p->vCounts[1]) );
/*
    Vec_IntForEachEntryStop( p->vCounts[0], Bit0, k0, Abc_MinInt(Vec_IntSize(p->vCounts[0]), 8) )
    Vec_IntForEachEntryStop( p->vCounts[1], Bit1, k1, Abc_MinInt(Vec_IntSize(p->vCounts[1]), 8) )
    {
        printf( "%3d %3d : ", Bit0, Bit1 );
        Vec_IntForEachEntryStop( p->vWinObjs, Id, i, nDivs )
        {
            word * pSims = Sbd_ObjSim0( p, Id );
            word * pCtrl = Sbd_ObjSim2( p, Id );
            if ( i == nDivs-1 )
                printf( " " );
            printf( "%c", (Abc_TtGetBit(pCtrl, Bit0) && Abc_TtGetBit(pCtrl, Bit1) && Abc_TtGetBit(pSims, Bit0) != Abc_TtGetBit(pSims, Bit1)) ? '1' : '.' );
        }
        printf( "\n" );
    }
*/
    Vec_WrdClear( p->vMatrix );
    Vec_IntForEachEntryStop( p->vCounts[0], Bit0, k0, Abc_MinInt(Vec_IntSize(p->vCounts[0]), 64) )
    Vec_IntForEachEntryStop( p->vCounts[1], Bit1, k1, Abc_MinInt(Vec_IntSize(p->vCounts[1]), 64) )
    {
        word Row = 0;
        Vec_IntForEachEntryStop( p->vWinObjs, Id, i, nDivs )
        {
            word * pSims = Sbd_ObjSim0( p, Id );
            word * pCtrl = Sbd_ObjSim2( p, Id );
            if ( Abc_TtGetBit(pCtrl, Bit0) && Abc_TtGetBit(pCtrl, Bit1) && Abc_TtGetBit(pSims, Bit0) != Abc_TtGetBit(pSims, Bit1) )
                Abc_TtXorBit( &Row, i );
        }
        if ( Vec_WrdPushUnique( p->vMatrix, Row ) )
            continue;
        for ( i = 0; i < nDivs; i++ )
            printf( "%d", (int)((Row >> i) & 1) );
        printf( "\n" );
    }
}